

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

bool __thiscall duckdb::FileSystem::IsPathAbsolute(FileSystem *this,string *path)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  string path_separator;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (*this->_vptr_FileSystem[0x18])(local_40,this,path);
  lVar4 = ::std::__cxx11::string::rfind((char *)path,(ulong)local_40[0],0);
  if (lVar4 == 0) {
    bVar5 = true;
  }
  else {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_80 = local_70;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
    local_60 = local_50;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"file:/","");
    puVar2 = local_60;
    if (local_78 < local_58) {
      bVar5 = false;
    }
    else if (local_58 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_60,local_80,local_58);
      bVar5 = iVar3 == 0;
    }
    if (puVar2 != local_50) {
      operator_delete(puVar2);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return bVar5;
}

Assistant:

bool FileSystem::IsPathAbsolute(const string &path) {
	auto path_separator = PathSeparator(path);
	return PathMatched(path, path_separator) || StringUtil::StartsWith(path, "file:/");
}